

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O3

void __thiscall OpenMD::Molecule::addBond(Molecule *this,Bond *bond)

{
  pointer *pppBVar1;
  iterator __position;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  _Var2;
  Bond *local_10;
  
  local_10 = bond;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Bond**,std::vector<OpenMD::Bond*,std::allocator<OpenMD::Bond*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Bond*const>>
                    ((this->bonds_).
                     super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->bonds_).
                     super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current ==
        (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<OpenMD::Bond*,std::allocator<OpenMD::Bond*>>::
      _M_realloc_insert<OpenMD::Bond*const&>
                ((vector<OpenMD::Bond*,std::allocator<OpenMD::Bond*>> *)&this->bonds_,__position,
                 &local_10);
    }
    else {
      *__position._M_current = local_10;
      pppBVar1 = &(this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
  }
  return;
}

Assistant:

void Molecule::addBond(Bond* bond) {
    if (std::find(bonds_.begin(), bonds_.end(), bond) == bonds_.end()) {
      bonds_.push_back(bond);
    }
  }